

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  size_t s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  ifstream fin;
  char buffer [16384];
  string local_42c0;
  string local_42a0;
  string local_4280;
  undefined8 local_4260;
  char *local_4258;
  size_t local_4250;
  char *local_4248;
  long local_4240;
  size_t local_4238;
  byte abStack_4220 [488];
  basic_string_view<char,_std::char_traits<char>_> local_4038;
  size_t local_4028;
  char *local_4020;
  undefined8 local_4018;
  char *local_4010;
  size_type local_4008;
  char *local_4000;
  
  std::ifstream::ifstream(&local_4240,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(local_4240 + -0x18)] & 5) == 0) {
    bVar3 = true;
    if (size != 0) {
      do {
        s = 0x4000;
        if (size < 0x4000) {
          s = size;
        }
        std::istream::read((char *)&local_4240,(long)&local_4038);
        if (local_4238 != s) {
          sVar1 = strlen(file);
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          local_4280._M_dataplus._M_p = (pointer)0xf;
          local_4280._M_string_length = 0x25e22c;
          local_4260 = 3;
          local_4258 = "\": ";
          local_4250 = local_42a0._M_string_length;
          local_4248 = local_42a0._M_dataplus._M_p;
          views_00._M_len = 4;
          views_00._M_array = (iterator)&local_4280;
          local_4280.field_2._M_allocated_capacity = sVar1;
          local_4280.field_2._8_8_ = file;
          cmCatViews_abi_cxx11_(&local_42c0,views_00);
LAB_0011d463:
          std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_42c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_42c0._M_dataplus._M_p != &local_42c0.field_2) {
            operator_delete(local_42c0._M_dataplus._M_p,local_42c0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_42a0._M_dataplus._M_p != &local_42a0.field_2) goto LAB_0011d4a4;
          goto LAB_0011d4ac;
        }
        sVar2 = archive_write_data(this->Archive,&local_4038,s);
        if (sVar2 != s) {
          cm_archive_error_string_abi_cxx11_(&local_42a0,this->Archive);
          local_4280._M_dataplus._M_p = (pointer)0x14;
          local_4280._M_string_length = 0x25e217;
          local_4280.field_2._M_allocated_capacity = local_42a0._M_string_length;
          local_4280.field_2._8_8_ = local_42a0._M_dataplus._M_p;
          views_01._M_len = 2;
          views_01._M_array = (iterator)&local_4280;
          cmCatViews_abi_cxx11_(&local_42c0,views_01);
          goto LAB_0011d463;
        }
        size = size - s;
      } while (size != 0);
    }
  }
  else {
    sVar1 = strlen(file);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    local_4038._M_len = 0xf;
    local_4038._M_str = "Error opening \"";
    local_4018 = 3;
    local_4010 = "\": ";
    local_4008 = local_42c0._M_string_length;
    local_4000 = local_42c0._M_dataplus._M_p;
    views._M_len = 4;
    views._M_array = &local_4038;
    local_4028 = sVar1;
    local_4020 = file;
    cmCatViews_abi_cxx11_(&local_4280,views);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_4280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4280._M_dataplus._M_p != &local_4280.field_2) {
      operator_delete(local_4280._M_dataplus._M_p,local_4280.field_2._M_allocated_capacity + 1);
    }
    local_42a0.field_2._M_allocated_capacity = local_42c0.field_2._M_allocated_capacity;
    local_42a0._M_dataplus._M_p = local_42c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_42c0._M_dataplus._M_p != &local_42c0.field_2) {
LAB_0011d4a4:
      operator_delete(local_42a0._M_dataplus._M_p,local_42a0.field_2._M_allocated_capacity + 1);
    }
LAB_0011d4ac:
    bVar3 = false;
  }
  std::ifstream::~ifstream(&local_4240);
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = cmStrCat("Error opening \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    using ssize_type = std::streamsize;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = cmStrCat("archive_write_data: ",
                             cm_archive_error_string(this->Archive));
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = cmStrCat("Error reading \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }
  return true;
}